

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::InstanceArrayIntersectorKMB<8>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [32];
  uint uVar26;
  ulong uVar27;
  Primitive_conflict4 *prim;
  ulong *puVar28;
  bool bVar29;
  byte bVar30;
  ulong uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  vbool<8>_conflict valid_leaf;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  vbool<8>_conflict local_2732;
  Precalculations local_2731;
  RayQueryContext *local_2730;
  long local_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 uStack_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar34 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
    uVar27 = vpcmpeqd_avx512vl(auVar34,(undefined1  [32])valid_i->field_0);
    bVar30 = (byte)uVar27;
    if (bVar30 != 0) {
      auVar34 = *(undefined1 (*) [32])(ray + 0x80);
      auVar35 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar36 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar39._16_4_ = 0x7fffffff;
      auVar39._20_4_ = 0x7fffffff;
      auVar39._24_4_ = 0x7fffffff;
      auVar39._28_4_ = 0x7fffffff;
      auVar33 = vandps_avx(auVar36,auVar39);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      auVar40._16_4_ = 0x219392ef;
      auVar40._20_4_ = 0x219392ef;
      auVar40._24_4_ = 0x219392ef;
      auVar40._28_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar33,auVar40,1);
      bVar3 = (bool)((byte)uVar24 & 1);
      auVar33._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._0_4_;
      bVar3 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar33._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._4_4_;
      bVar3 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar33._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._8_4_;
      bVar3 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar33._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._12_4_;
      bVar3 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar33._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._16_4_;
      bVar3 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar33._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._20_4_;
      bVar3 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar33._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._24_4_;
      bVar3 = SUB81(uVar24 >> 7,0);
      auVar33._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._28_4_;
      auVar32 = vrcp14ps_avx512vl(auVar33);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = &DAT_3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar41._16_4_ = 0x3f800000;
      auVar41._20_4_ = 0x3f800000;
      auVar41._24_4_ = 0x3f800000;
      auVar41._28_4_ = 0x3f800000;
      auVar12 = vfnmadd213ps_fma(auVar33,auVar32,auVar41);
      auVar36 = vandps_avx(auVar35,auVar39);
      uVar24 = vcmpps_avx512vl(auVar36,auVar40,1);
      bVar3 = (bool)((byte)uVar24 & 1);
      auVar36._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar35._0_4_;
      bVar3 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar35._4_4_;
      bVar3 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar35._8_4_;
      bVar3 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar35._12_4_;
      bVar3 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar35._16_4_;
      bVar3 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar35._20_4_;
      bVar3 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar35._24_4_;
      bVar3 = SUB81(uVar24 >> 7,0);
      auVar36._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar35._28_4_;
      auVar33 = vrcp14ps_avx512vl(auVar36);
      auVar13 = vfnmadd213ps_fma(auVar36,auVar33,auVar41);
      auVar35 = vandps_avx(auVar34,auVar39);
      uVar24 = vcmpps_avx512vl(auVar35,auVar40,1);
      bVar3 = (bool)((byte)uVar24 & 1);
      auVar35._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar34._0_4_;
      bVar3 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar34._4_4_;
      bVar3 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar34._8_4_;
      bVar3 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar34._12_4_;
      bVar3 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar35._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar34._16_4_;
      bVar3 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar35._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar34._20_4_;
      bVar3 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar35._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar34._24_4_;
      bVar3 = SUB81(uVar24 >> 7,0);
      auVar35._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar34._28_4_;
      auVar34 = vrcp14ps_avx512vl(auVar35);
      auVar14 = vfnmadd213ps_fma(auVar35,auVar34,auVar41);
      auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar34,auVar34);
      auVar51 = ZEXT1664(auVar14);
      auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar33,auVar33);
      auVar52 = ZEXT1664(auVar13);
      auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar32,auVar32);
      auVar53 = ZEXT1664(auVar12);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar54 = ZEXT3264(local_1e80);
      auVar34 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
      local_1e60._0_4_ = (uint)(bVar30 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar30 & 1) * 0x7f800000
      ;
      bVar3 = (bool)((byte)(uVar27 >> 1) & 1);
      local_1e60._4_4_ = (uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar27 >> 2) & 1);
      local_1e60._8_4_ = (uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar27 >> 3) & 1);
      local_1e60._12_4_ = (uint)bVar3 * auVar34._12_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar27 >> 4) & 1);
      local_1e60._16_4_ = (uint)bVar3 * auVar34._16_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar27 >> 5) & 1);
      local_1e60._20_4_ = (uint)bVar3 * auVar34._20_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar27 >> 6) & 1);
      local_1e60._24_4_ = (uint)bVar3 * auVar34._24_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = SUB81(uVar27 >> 7,0);
      local_1e60._28_4_ = (uint)bVar3 * auVar34._28_4_ | (uint)!bVar3 * 0x7f800000;
      auVar55 = ZEXT3264(local_1e60);
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar35 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40));
      bVar3 = (bool)((byte)(uVar27 >> 1) & 1);
      bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar27 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar27 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar27 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar27 >> 6) & 1);
      bVar8 = SUB81(uVar27 >> 7,0);
      auVar56 = ZEXT3264(CONCAT428((uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar34._28_4_,
                                   CONCAT424((uint)bVar7 * auVar35._24_4_ |
                                             (uint)!bVar7 * auVar34._24_4_,
                                             CONCAT420((uint)bVar6 * auVar35._20_4_ |
                                                       (uint)!bVar6 * auVar34._20_4_,
                                                       CONCAT416((uint)bVar5 * auVar35._16_4_ |
                                                                 (uint)!bVar5 * auVar34._16_4_,
                                                                 CONCAT412((uint)bVar4 *
                                                                           auVar35._12_4_ |
                                                                           (uint)!bVar4 *
                                                                           auVar34._12_4_,
                                                                           CONCAT48((uint)bVar29 *
                                                                                    auVar35._8_4_ |
                                                                                    (uint)!bVar29 *
                                                                                    auVar34._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar3 * auVar35._4_4_ |
                                                  (uint)!bVar3 * auVar34._4_4_,
                                                  (uint)(bVar30 & 1) * auVar35._0_4_ |
                                                  (uint)!(bool)(bVar30 & 1) * auVar34._0_4_))))))));
      puVar28 = local_2608 + 1;
      auVar34 = *(undefined1 (*) [32])ray;
      auVar37._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar37._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar37._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar37._16_4_ = auVar34._16_4_ ^ 0x80000000;
      auVar37._20_4_ = auVar34._20_4_ ^ 0x80000000;
      auVar37._24_4_ = auVar34._24_4_ ^ 0x80000000;
      auVar37._28_4_ = auVar34._28_4_ ^ 0x80000000;
      pauVar25 = (undefined1 (*) [32])local_1e40;
      auVar34 = vmulps_avx512vl(ZEXT1632(auVar14),auVar37);
      auVar57 = ZEXT3264(auVar34);
      auVar34 = *(undefined1 (*) [32])(ray + 0x20);
      auVar38._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar38._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar38._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar38._16_4_ = auVar34._16_4_ ^ 0x80000000;
      auVar38._20_4_ = auVar34._20_4_ ^ 0x80000000;
      auVar38._24_4_ = auVar34._24_4_ ^ 0x80000000;
      auVar38._28_4_ = auVar34._28_4_ ^ 0x80000000;
      auVar34 = *(undefined1 (*) [32])(ray + 0x40);
      auVar32._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar32._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar32._12_4_ = auVar34._12_4_ ^ 0x80000000;
      auVar32._16_4_ = auVar34._16_4_ ^ 0x80000000;
      auVar32._20_4_ = auVar34._20_4_ ^ 0x80000000;
      auVar32._24_4_ = auVar34._24_4_ ^ 0x80000000;
      auVar32._28_4_ = auVar34._28_4_ ^ 0x80000000;
      auVar34 = vmulps_avx512vl(ZEXT1632(auVar13),auVar38);
      auVar58 = ZEXT3264(auVar34);
      auVar34 = vmulps_avx512vl(ZEXT1632(auVar12),auVar32);
      auVar59 = ZEXT3264(auVar34);
      uStack_2610 = 0xfffffffffffffff8;
      local_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      local_2730 = context;
      do {
        pauVar25 = pauVar25 + -1;
        uVar27 = puVar28[-1];
        puVar28 = puVar28 + -1;
        bVar3 = true;
        if (uVar27 != 0xfffffffffffffff8) {
          auVar44 = ZEXT3264(*pauVar25);
          local_26c0 = auVar56._0_32_;
          uVar9 = vcmpps_avx512vl(*pauVar25,local_26c0,1);
          if ((char)uVar9 != '\0') {
            do {
              auVar34 = auVar44._0_32_;
              uVar26 = (uint)uVar27;
              local_2640 = auVar51._0_32_;
              local_26e0 = auVar57._0_32_;
              local_2660 = auVar52._0_32_;
              local_2700 = auVar58._0_32_;
              local_2680 = auVar53._0_32_;
              local_2720 = auVar59._0_32_;
              local_26a0 = auVar55._0_32_;
              if ((uVar27 & 8) != 0) {
                if (uVar27 == 0xfffffffffffffff8) goto LAB_007bbe38;
                uVar9 = vcmpps_avx512vl(local_26c0,auVar34,6);
                local_2732.v = (__mmask8)uVar9;
                if (local_2732.v != 0) {
                  local_2728 = (ulong)(uVar26 & 0xf) - 8;
                  if (local_2728 != 0) {
                    prim = (Primitive_conflict4 *)(uVar27 & 0xfffffffffffffff0);
                    do {
                      InstanceArrayIntersectorKMB<8>::intersect
                                (&local_2732,&local_2731,ray,local_2730,prim);
                      prim = prim + 1;
                      local_2728 = local_2728 + -1;
                    } while (local_2728 != 0);
                  }
                  bVar3 = (bool)(local_2732.v >> 1 & 1);
                  bVar29 = (bool)(local_2732.v >> 2 & 1);
                  bVar4 = (bool)(local_2732.v >> 3 & 1);
                  bVar5 = (bool)(local_2732.v >> 4 & 1);
                  bVar6 = (bool)(local_2732.v >> 5 & 1);
                  bVar7 = (bool)(local_2732.v >> 6 & 1);
                  auVar56 = ZEXT3264(CONCAT428((uint)(local_2732.v >> 7) * *(int *)(ray + 0x11c) |
                                               (uint)!(bool)(local_2732.v >> 7) * local_26c0._28_4_,
                                               CONCAT424((uint)bVar7 * *(int *)(ray + 0x118) |
                                                         (uint)!bVar7 * local_26c0._24_4_,
                                                         CONCAT420((uint)bVar6 *
                                                                   *(int *)(ray + 0x114) |
                                                                   (uint)!bVar6 * local_26c0._20_4_,
                                                                   CONCAT416((uint)bVar5 *
                                                                             *(int *)(ray + 0x110) |
                                                                             (uint)!bVar5 *
                                                                             local_26c0._16_4_,
                                                                             CONCAT412((uint)bVar4 *
                                                                                       *(int *)(ray 
                                                  + 0x10c) | (uint)!bVar4 * local_26c0._12_4_,
                                                  CONCAT48((uint)bVar29 * *(int *)(ray + 0x108) |
                                                           (uint)!bVar29 * local_26c0._8_4_,
                                                           CONCAT44((uint)bVar3 *
                                                                    *(int *)(ray + 0x104) |
                                                                    (uint)!bVar3 * local_26c0._4_4_,
                                                                    (uint)(local_2732.v & 1) *
                                                                    *(int *)(ray + 0x100) |
                                                                    (uint)!(bool)(local_2732.v & 1)
                                                                    * local_26c0._0_4_))))))));
                  auVar51 = ZEXT3264(local_2640);
                  auVar52 = ZEXT3264(local_2660);
                  auVar53 = ZEXT3264(local_2680);
                  auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar55 = ZEXT3264(local_26a0);
                  auVar57 = ZEXT3264(local_26e0);
                  auVar58 = ZEXT3264(local_2700);
                  auVar59 = ZEXT3264(local_2720);
                }
                break;
              }
              uVar22 = uVar27 & 0xfffffffffffffff0;
              uVar23 = 0;
              auVar44 = ZEXT3264(auVar54._0_32_);
              uVar24 = 0;
              uVar27 = 8;
              do {
                uVar2 = *(ulong *)(uVar22 + uVar24 * 8);
                if (uVar2 != 8) {
                  uVar1 = *(undefined4 *)(uVar22 + 0x80 + uVar24 * 4);
                  auVar45._4_4_ = uVar1;
                  auVar45._0_4_ = uVar1;
                  auVar45._8_4_ = uVar1;
                  auVar45._12_4_ = uVar1;
                  auVar45._16_4_ = uVar1;
                  auVar45._20_4_ = uVar1;
                  auVar45._24_4_ = uVar1;
                  auVar45._28_4_ = uVar1;
                  auVar35 = *(undefined1 (*) [32])(ray + 0xe0);
                  uVar1 = *(undefined4 *)(uVar22 + 0x20 + uVar24 * 4);
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar42._16_4_ = uVar1;
                  auVar42._20_4_ = uVar1;
                  auVar42._24_4_ = uVar1;
                  auVar42._28_4_ = uVar1;
                  auVar36 = vfmadd213ps_avx512vl(auVar45,auVar35,auVar42);
                  uVar1 = *(undefined4 *)(uVar22 + 0xa0 + uVar24 * 4);
                  auVar46._4_4_ = uVar1;
                  auVar46._0_4_ = uVar1;
                  auVar46._8_4_ = uVar1;
                  auVar46._12_4_ = uVar1;
                  auVar46._16_4_ = uVar1;
                  auVar46._20_4_ = uVar1;
                  auVar46._24_4_ = uVar1;
                  auVar46._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar22 + 0x40 + uVar24 * 4);
                  auVar15._4_4_ = uVar1;
                  auVar15._0_4_ = uVar1;
                  auVar15._8_4_ = uVar1;
                  auVar15._12_4_ = uVar1;
                  auVar15._16_4_ = uVar1;
                  auVar15._20_4_ = uVar1;
                  auVar15._24_4_ = uVar1;
                  auVar15._28_4_ = uVar1;
                  auVar33 = vfmadd213ps_avx512vl(auVar46,auVar35,auVar15);
                  uVar1 = *(undefined4 *)(uVar22 + 0xc0 + uVar24 * 4);
                  auVar47._4_4_ = uVar1;
                  auVar47._0_4_ = uVar1;
                  auVar47._8_4_ = uVar1;
                  auVar47._12_4_ = uVar1;
                  auVar47._16_4_ = uVar1;
                  auVar47._20_4_ = uVar1;
                  auVar47._24_4_ = uVar1;
                  auVar47._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar22 + 0x60 + uVar24 * 4);
                  auVar16._4_4_ = uVar1;
                  auVar16._0_4_ = uVar1;
                  auVar16._8_4_ = uVar1;
                  auVar16._12_4_ = uVar1;
                  auVar16._16_4_ = uVar1;
                  auVar16._20_4_ = uVar1;
                  auVar16._24_4_ = uVar1;
                  auVar16._28_4_ = uVar1;
                  auVar32 = vfmadd213ps_avx512vl(auVar47,auVar35,auVar16);
                  uVar1 = *(undefined4 *)(uVar22 + 0x90 + uVar24 * 4);
                  auVar48._4_4_ = uVar1;
                  auVar48._0_4_ = uVar1;
                  auVar48._8_4_ = uVar1;
                  auVar48._12_4_ = uVar1;
                  auVar48._16_4_ = uVar1;
                  auVar48._20_4_ = uVar1;
                  auVar48._24_4_ = uVar1;
                  auVar48._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar22 + 0x30 + uVar24 * 4);
                  auVar17._4_4_ = uVar1;
                  auVar17._0_4_ = uVar1;
                  auVar17._8_4_ = uVar1;
                  auVar17._12_4_ = uVar1;
                  auVar17._16_4_ = uVar1;
                  auVar17._20_4_ = uVar1;
                  auVar17._24_4_ = uVar1;
                  auVar17._28_4_ = uVar1;
                  auVar37 = vfmadd213ps_avx512vl(auVar48,auVar35,auVar17);
                  uVar1 = *(undefined4 *)(uVar22 + 0xb0 + uVar24 * 4);
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar49._16_4_ = uVar1;
                  auVar49._20_4_ = uVar1;
                  auVar49._24_4_ = uVar1;
                  auVar49._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar22 + 0x50 + uVar24 * 4);
                  auVar18._4_4_ = uVar1;
                  auVar18._0_4_ = uVar1;
                  auVar18._8_4_ = uVar1;
                  auVar18._12_4_ = uVar1;
                  auVar18._16_4_ = uVar1;
                  auVar18._20_4_ = uVar1;
                  auVar18._24_4_ = uVar1;
                  auVar18._28_4_ = uVar1;
                  auVar38 = vfmadd213ps_avx512vl(auVar49,auVar35,auVar18);
                  uVar1 = *(undefined4 *)(uVar22 + 0xd0 + uVar24 * 4);
                  auVar50._4_4_ = uVar1;
                  auVar50._0_4_ = uVar1;
                  auVar50._8_4_ = uVar1;
                  auVar50._12_4_ = uVar1;
                  auVar50._16_4_ = uVar1;
                  auVar50._20_4_ = uVar1;
                  auVar50._24_4_ = uVar1;
                  auVar50._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar22 + 0x70 + uVar24 * 4);
                  auVar19._4_4_ = uVar1;
                  auVar19._0_4_ = uVar1;
                  auVar19._8_4_ = uVar1;
                  auVar19._12_4_ = uVar1;
                  auVar19._16_4_ = uVar1;
                  auVar19._20_4_ = uVar1;
                  auVar19._24_4_ = uVar1;
                  auVar19._28_4_ = uVar1;
                  auVar39 = vfmadd213ps_avx512vl(auVar50,auVar35,auVar19);
                  auVar40 = vfmadd213ps_avx512vl(auVar36,local_2640,local_26e0);
                  auVar41 = vfmadd213ps_avx512vl(auVar33,local_2660,local_2700);
                  auVar42 = vfmadd213ps_avx512vl(auVar32,local_2680,local_2720);
                  auVar32 = vfmadd213ps_avx512vl(auVar37,local_2640,local_26e0);
                  auVar37 = vfmadd213ps_avx512vl(auVar38,local_2660,local_2700);
                  auVar38 = vfmadd213ps_avx512vl(auVar39,local_2680,local_2720);
                  auVar36 = vpminsd_avx2(auVar40,auVar32);
                  auVar33 = vpminsd_avx2(auVar41,auVar37);
                  auVar36 = vpmaxsd_avx2(auVar36,auVar33);
                  auVar33 = vpminsd_avx2(auVar42,auVar38);
                  auVar36 = vpmaxsd_avx2(auVar36,auVar33);
                  auVar33 = vpmaxsd_avx2(auVar40,auVar32);
                  auVar32 = vpmaxsd_avx2(auVar41,auVar37);
                  auVar37 = vpminsd_avx2(auVar33,auVar32);
                  auVar33 = vpmaxsd_avx2(auVar42,auVar38);
                  auVar32 = vpmaxsd_avx2(auVar36,local_26a0);
                  auVar33 = vpminsd_avx512vl(auVar33,local_26c0);
                  auVar33 = vpminsd_avx2(auVar37,auVar33);
                  uVar31 = vcmpps_avx512vl(auVar32,auVar33,2);
                  if ((uVar26 & 7) == 6) {
                    uVar1 = *(undefined4 *)(uVar22 + 0xe0 + uVar24 * 4);
                    auVar20._4_4_ = uVar1;
                    auVar20._0_4_ = uVar1;
                    auVar20._8_4_ = uVar1;
                    auVar20._12_4_ = uVar1;
                    auVar20._16_4_ = uVar1;
                    auVar20._20_4_ = uVar1;
                    auVar20._24_4_ = uVar1;
                    auVar20._28_4_ = uVar1;
                    uVar10 = vcmpps_avx512vl(auVar35,auVar20,0xd);
                    uVar1 = *(undefined4 *)(uVar22 + 0xf0 + uVar24 * 4);
                    auVar21._4_4_ = uVar1;
                    auVar21._0_4_ = uVar1;
                    auVar21._8_4_ = uVar1;
                    auVar21._12_4_ = uVar1;
                    auVar21._16_4_ = uVar1;
                    auVar21._20_4_ = uVar1;
                    auVar21._24_4_ = uVar1;
                    auVar21._28_4_ = uVar1;
                    uVar11 = vcmpps_avx512vl(auVar35,auVar21,1);
                    uVar31 = uVar31 & uVar10 & uVar11;
                  }
                  uVar10 = vcmpps_avx512vl(local_26c0,auVar34,6);
                  uVar31 = uVar31 & uVar10;
                  if ((byte)uVar31 != 0) {
                    auVar36 = vblendmps_avx512vl(auVar54._0_32_,auVar36);
                    bVar29 = (bool)((byte)uVar31 & 1);
                    auVar43._0_4_ = (uint)bVar29 * auVar36._0_4_ | (uint)!bVar29 * auVar35._0_4_;
                    bVar29 = (bool)((byte)(uVar31 >> 1) & 1);
                    auVar43._4_4_ = (uint)bVar29 * auVar36._4_4_ | (uint)!bVar29 * auVar35._4_4_;
                    bVar29 = (bool)((byte)(uVar31 >> 2) & 1);
                    auVar43._8_4_ = (uint)bVar29 * auVar36._8_4_ | (uint)!bVar29 * auVar35._8_4_;
                    bVar29 = (bool)((byte)(uVar31 >> 3) & 1);
                    auVar43._12_4_ = (uint)bVar29 * auVar36._12_4_ | (uint)!bVar29 * auVar35._12_4_;
                    bVar29 = (bool)((byte)(uVar31 >> 4) & 1);
                    auVar43._16_4_ = (uint)bVar29 * auVar36._16_4_ | (uint)!bVar29 * auVar35._16_4_;
                    bVar29 = (bool)((byte)(uVar31 >> 5) & 1);
                    auVar43._20_4_ = (uint)bVar29 * auVar36._20_4_ | (uint)!bVar29 * auVar35._20_4_;
                    bVar29 = (bool)((byte)(uVar31 >> 6) & 1);
                    auVar43._24_4_ = (uint)bVar29 * auVar36._24_4_ | (uint)!bVar29 * auVar35._24_4_;
                    bVar29 = SUB81(uVar31 >> 7,0);
                    auVar43._28_4_ = (uint)bVar29 * auVar36._28_4_ | (uint)!bVar29 * auVar35._28_4_;
                    auVar33 = auVar44._0_32_;
                    uVar9 = vcmpps_avx512vl(auVar43,auVar33,1);
                    uVar31 = uVar2;
                    auVar35 = auVar33;
                    auVar36 = auVar43;
                    if (((char)uVar9 == '\0') ||
                       (bVar29 = uVar27 != 8, uVar31 = uVar27, uVar27 = uVar2, auVar35 = auVar43,
                       auVar36 = auVar33, bVar29)) {
                      uVar23 = uVar23 + 1;
                      *puVar28 = uVar31;
                      puVar28 = puVar28 + 1;
                      *pauVar25 = auVar36;
                      pauVar25 = pauVar25 + 1;
                      auVar44 = ZEXT3264(auVar35);
                    }
                    else {
                      auVar44 = ZEXT3264(auVar43);
                    }
                  }
                }
              } while ((uVar2 != 8) && (bVar29 = uVar24 < 3, uVar24 = uVar24 + 1, bVar29));
              if (1 < uVar23 && uVar27 != 8) {
                auVar34 = pauVar25[-2];
                uVar9 = vcmpps_avx512vl(auVar34,pauVar25[-1],1);
                if ((char)uVar9 != '\0') {
                  pauVar25[-2] = pauVar25[-1];
                  pauVar25[-1] = auVar34;
                  auVar14 = vpermilps_avx(*(undefined1 (*) [16])(puVar28 + -2),0x4e);
                  *(undefined1 (*) [16])(puVar28 + -2) = auVar14;
                }
                if (uVar23 != 2) {
                  auVar34 = pauVar25[-3];
                  uVar9 = vcmpps_avx512vl(auVar34,pauVar25[-1],1);
                  if ((char)uVar9 != '\0') {
                    pauVar25[-3] = pauVar25[-1];
                    pauVar25[-1] = auVar34;
                    uVar24 = puVar28[-3];
                    puVar28[-3] = puVar28[-1];
                    puVar28[-1] = uVar24;
                  }
                  auVar34 = pauVar25[-3];
                  uVar9 = vcmpps_avx512vl(auVar34,pauVar25[-2],1);
                  if ((char)uVar9 != '\0') {
                    pauVar25[-3] = pauVar25[-2];
                    pauVar25[-2] = auVar34;
                    auVar14 = vpermilps_avx(*(undefined1 (*) [16])(puVar28 + -3),0x4e);
                    *(undefined1 (*) [16])(puVar28 + -3) = auVar14;
                  }
                }
              }
            } while (uVar27 != 8);
          }
          bVar3 = false;
        }
LAB_007bbe38:
      } while (!bVar3);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }